

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer.cpp
# Opt level: O1

void __thiscall
dynamicgraph::Tracer::addSignalToTraceByName(Tracer *this,string *signame,string *filename)

{
  istringstream *piVar1;
  SignalBase<int> *sig;
  istringstream iss;
  istringstream local_190 [120];
  ios_base local_118 [264];
  
  std::__cxx11::istringstream::istringstream(local_190,(string *)signame,_S_in);
  piVar1 = (istringstream *)dynamicgraph::PoolStorage::getInstance();
  sig = (SignalBase<int> *)dynamicgraph::PoolStorage::getSignal(piVar1);
  addSignalToTrace(this,sig,filename);
  std::__cxx11::istringstream::~istringstream(local_190);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void Tracer::addSignalToTraceByName(const string &signame,
                                    const string &filename) {
  dgDEBUGIN(15);
  istringstream iss(signame);
  SignalBase<int> &sig = PoolStorage::getInstance()->getSignal(iss);
  addSignalToTrace(sig, filename);
  dgDEBUGOUT(15);
}